

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_file.cc
# Opt level: O0

void google::protobuf::compiler::java::anon_unknown_0::CollectExtensions
               (FileDescriptorProto *file_proto,DescriptorPool *alternate_pool,
               FieldDescriptorSet *extensions,string *file_data)

{
  FieldDescriptorSet *this;
  bool bVar1;
  int iVar2;
  Descriptor *this_00;
  string *psVar3;
  Message *pMVar4;
  undefined4 extraout_var;
  MessageLite *this_01;
  LogMessage *pLVar5;
  LogFinisher local_16a;
  byte local_169;
  LogMessage local_168;
  LogFinisher local_12a;
  byte local_129;
  LogMessage local_128;
  LogFinisher local_ea;
  byte local_e9;
  LogMessage local_e8;
  scoped_ptr<google::protobuf::Message> local_b0;
  scoped_ptr<google::protobuf::Message> dynamic_file_proto;
  DynamicMessageFactory factory;
  LogMessage local_68;
  Descriptor *local_30;
  Descriptor *file_proto_desc;
  string *file_data_local;
  FieldDescriptorSet *extensions_local;
  DescriptorPool *alternate_pool_local;
  FileDescriptorProto *file_proto_local;
  
  file_proto_desc = (Descriptor *)file_data;
  file_data_local = (string *)extensions;
  extensions_local = (FieldDescriptorSet *)alternate_pool;
  alternate_pool_local = (DescriptorPool *)file_proto;
  bVar1 = CollectExtensions(&file_proto->super_Message,extensions);
  this = extensions_local;
  if (!bVar1) {
    this_00 = Message::GetDescriptor((Message *)alternate_pool_local);
    psVar3 = Descriptor::full_name_abi_cxx11_(this_00);
    local_30 = DescriptorPool::FindMessageTypeByName((DescriptorPool *)this,psVar3);
    if (local_30 == (Descriptor *)0x0) {
      internal::LogMessage::LogMessage
                (&local_68,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/compiler/java/java_file.cc"
                 ,0x84);
      pLVar5 = internal::LogMessage::operator<<(&local_68,"CHECK failed: file_proto_desc: ");
      pLVar5 = internal::LogMessage::operator<<
                         (pLVar5,"Find unknown fields in FileDescriptorProto when building ");
      psVar3 = FileDescriptorProto::name_abi_cxx11_((FileDescriptorProto *)alternate_pool_local);
      pLVar5 = internal::LogMessage::operator<<(pLVar5,psVar3);
      pLVar5 = internal::LogMessage::operator<<
                         (pLVar5,
                          ". It\'s likely that those fields are custom options, however, descriptor.proto is not in the transitive dependencies. This normally should not happen. Please report a bug."
                         );
      internal::LogFinisher::operator=
                ((LogFinisher *)((long)&factory.prototypes_mutex_.mInternal + 3),pLVar5);
      internal::LogMessage::~LogMessage(&local_68);
    }
    DynamicMessageFactory::DynamicMessageFactory((DynamicMessageFactory *)&dynamic_file_proto);
    pMVar4 = DynamicMessageFactory::GetPrototype
                       ((DynamicMessageFactory *)&dynamic_file_proto,local_30);
    iVar2 = (*(pMVar4->super_MessageLite)._vptr_MessageLite[3])();
    internal::scoped_ptr<google::protobuf::Message>::scoped_ptr
              (&local_b0,(Message *)CONCAT44(extraout_var,iVar2));
    local_e9 = 0;
    pMVar4 = internal::scoped_ptr<google::protobuf::Message>::get(&local_b0);
    if (pMVar4 == (Message *)0x0) {
      internal::LogMessage::LogMessage
                (&local_e8,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/compiler/java/java_file.cc"
                 ,0x8d);
      local_e9 = 1;
      pLVar5 = internal::LogMessage::operator<<
                         (&local_e8,"CHECK failed: dynamic_file_proto.get() != NULL: ");
      internal::LogFinisher::operator=(&local_ea,pLVar5);
    }
    if ((local_e9 & 1) != 0) {
      internal::LogMessage::~LogMessage(&local_e8);
    }
    local_129 = 0;
    this_01 = &internal::scoped_ptr<google::protobuf::Message>::operator->(&local_b0)->
               super_MessageLite;
    bVar1 = MessageLite::ParseFromString(this_01,(string *)file_proto_desc);
    if (!bVar1) {
      internal::LogMessage::LogMessage
                (&local_128,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/compiler/java/java_file.cc"
                 ,0x8e);
      local_129 = 1;
      pLVar5 = internal::LogMessage::operator<<
                         (&local_128,
                          "CHECK failed: dynamic_file_proto->ParseFromString(file_data): ");
      internal::LogFinisher::operator=(&local_12a,pLVar5);
    }
    if ((local_129 & 1) != 0) {
      internal::LogMessage::~LogMessage(&local_128);
    }
    std::
    set<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
    ::clear((set<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
             *)file_data_local);
    local_169 = 0;
    pMVar4 = internal::scoped_ptr<google::protobuf::Message>::operator*(&local_b0);
    bVar1 = CollectExtensions(pMVar4,(FieldDescriptorSet *)file_data_local);
    if (!bVar1) {
      internal::LogMessage::LogMessage
                (&local_168,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/compiler/java/java_file.cc"
                 ,0x94);
      local_169 = 1;
      pLVar5 = internal::LogMessage::operator<<
                         (&local_168,
                          "CHECK failed: CollectExtensions(*dynamic_file_proto, extensions): ");
      pLVar5 = internal::LogMessage::operator<<
                         (pLVar5,"Find unknown fields in FileDescriptorProto when building ");
      psVar3 = FileDescriptorProto::name_abi_cxx11_((FileDescriptorProto *)alternate_pool_local);
      pLVar5 = internal::LogMessage::operator<<(pLVar5,psVar3);
      pLVar5 = internal::LogMessage::operator<<
                         (pLVar5,
                          ". It\'s likely that those fields are custom options, however, those options cannot be recognized in the builder pool. This normally should not happen. Please report a bug."
                         );
      internal::LogFinisher::operator=(&local_16a,pLVar5);
    }
    if ((local_169 & 1) != 0) {
      internal::LogMessage::~LogMessage(&local_168);
    }
    internal::scoped_ptr<google::protobuf::Message>::~scoped_ptr(&local_b0);
    DynamicMessageFactory::~DynamicMessageFactory((DynamicMessageFactory *)&dynamic_file_proto);
  }
  return;
}

Assistant:

void CollectExtensions(const FileDescriptorProto& file_proto,
                       const DescriptorPool& alternate_pool,
                       FieldDescriptorSet* extensions,
                       const string& file_data) {
  if (!CollectExtensions(file_proto, extensions)) {
    // There are unknown fields in the file_proto, which are probably
    // extensions. We need to parse the data into a dynamic message based on the
    // builder-pool to find out all extensions.
    const Descriptor* file_proto_desc = alternate_pool.FindMessageTypeByName(
        file_proto.GetDescriptor()->full_name());
    GOOGLE_CHECK(file_proto_desc)
        << "Find unknown fields in FileDescriptorProto when building "
        << file_proto.name()
        << ". It's likely that those fields are custom options, however, "
           "descriptor.proto is not in the transitive dependencies. "
           "This normally should not happen. Please report a bug.";
    DynamicMessageFactory factory;
    google::protobuf::scoped_ptr<Message> dynamic_file_proto(
        factory.GetPrototype(file_proto_desc)->New());
    GOOGLE_CHECK(dynamic_file_proto.get() != NULL);
    GOOGLE_CHECK(dynamic_file_proto->ParseFromString(file_data));

    // Collect the extensions again from the dynamic message. There should be no
    // more unknown fields this time, i.e. all the custom options should be
    // parsed as extensions now.
    extensions->clear();
    GOOGLE_CHECK(CollectExtensions(*dynamic_file_proto, extensions))
        << "Find unknown fields in FileDescriptorProto when building "
        << file_proto.name()
        << ". It's likely that those fields are custom options, however, "
           "those options cannot be recognized in the builder pool. "
           "This normally should not happen. Please report a bug.";
  }
}